

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt.c
# Opt level: O2

int build_cur_mv(int_mv *cur_mv,PREDICTION_MODE this_mode,AV1_COMMON *cm,MACROBLOCK *x,
                int skip_repeated_ref_mv)

{
  MV_REFERENCE_FRAME *ref_frame;
  MB_MODE_INFO_EXT *mbmi_ext;
  byte bVar1;
  uint uVar2;
  FULLPEL_MV mv;
  ulong uVar3;
  char *pcVar4;
  int_mv *piVar5;
  long lVar6;
  undefined7 in_register_00000031;
  uint uVar7;
  int_mv this_mv;
  int_mv *local_90;
  uint local_88;
  int local_84;
  FullMvLimits *local_80;
  AV1_COMMON *local_78;
  MACROBLOCK *local_70;
  char *local_68;
  char *local_60;
  MB_MODE_INFO *local_58;
  long local_50;
  SubpelMvLimits local_48;
  
  local_58 = *(x->e_mbd).mi;
  ref_frame = local_58->ref_frame;
  mbmi_ext = &x->mbmi_ext;
  uVar3 = CONCAT71(in_register_00000031,this_mode) & 0xffffffff;
  local_60 = compound_ref1_mode_lut + uVar3;
  local_68 = compound_ref0_mode_lut + uVar3;
  local_80 = &x->mv_limits;
  local_50 = (ulong)('\0' < local_58->ref_frame[1]) + 1;
  uVar7 = 1;
  lVar6 = 0;
  local_88 = (uint)this_mode;
  local_90 = cur_mv;
  local_84 = skip_repeated_ref_mv;
  local_78 = cm;
  local_70 = x;
  while( true ) {
    if (local_50 == lVar6) {
      return uVar7;
    }
    this_mv.as_int = 0x80008000;
    uVar7 = *(ushort *)&local_58->field_0xa7 >> 4 & 3;
    uVar2 = get_this_mv(&this_mv,(PREDICTION_MODE)local_88,(int)lVar6,uVar7,local_84,ref_frame,
                        mbmi_ext);
    if (uVar2 == 0) break;
    pcVar4 = local_60;
    if (lVar6 == 0) {
      pcVar4 = local_68;
    }
    if (*pcVar4 == '\x10') {
      bVar1 = av1_ref_frame_type(ref_frame);
      piVar5 = &mbmi_ext->ref_mv_stack[bVar1][uVar7].comp_mv;
      if (lVar6 == 0) {
        piVar5 = &mbmi_ext->ref_mv_stack[bVar1][uVar7].this_mv;
      }
      local_90[lVar6] = *piVar5;
      uVar7 = 1;
    }
    else {
      local_90[lVar6] = this_mv;
      if ((local_78->features).cur_frame_force_integer_mv == false) {
        if ((local_78->features).allow_high_precision_mv == false) {
          if ((this_mv.as_int & 1) != 0) {
            local_90[lVar6].as_mv.row = this_mv.as_mv.row + (ushort)(this_mv.as_mv.row < 1) * 2 + -1
            ;
          }
          if ((this_mv.as_int >> 0x10 & 1) != 0) {
            *(ushort *)((long)local_90 + lVar6 * 4 + 2) =
                 this_mv.as_mv.col + (ushort)(this_mv.as_mv.col < 1) * 2 + -1;
          }
        }
      }
      else {
        integer_mv_precision(&cur_mv->as_mv);
      }
      local_48.col_min = (local_70->e_mbd).mb_to_left_edge + -0x8e0;
      local_48.col_max = (local_70->e_mbd).mb_to_right_edge + 0x8e0;
      local_48.row_min = (local_70->e_mbd).mb_to_top_edge + -0x8e0;
      local_48.row_max = (local_70->e_mbd).mb_to_bottom_edge + 0x8e0;
      clamp_mv(&cur_mv->as_mv,&local_48);
      mv = get_fullmv_from_mv(&cur_mv->as_mv);
      uVar7 = av1_is_fullmv_in_range(local_80,mv);
      uVar7 = uVar7 & uVar2;
    }
    lVar6 = lVar6 + 1;
    cur_mv = cur_mv + 1;
  }
  return 0;
}

Assistant:

static inline int build_cur_mv(int_mv *cur_mv, PREDICTION_MODE this_mode,
                               const AV1_COMMON *cm, const MACROBLOCK *x,
                               int skip_repeated_ref_mv) {
  const MACROBLOCKD *xd = &x->e_mbd;
  const MB_MODE_INFO *mbmi = xd->mi[0];
  const int is_comp_pred = has_second_ref(mbmi);

  int ret = 1;
  for (int i = 0; i < is_comp_pred + 1; ++i) {
    int_mv this_mv;
    this_mv.as_int = INVALID_MV;
    ret = get_this_mv(&this_mv, this_mode, i, mbmi->ref_mv_idx,
                      skip_repeated_ref_mv, mbmi->ref_frame, &x->mbmi_ext);
    if (!ret) return 0;
    const PREDICTION_MODE single_mode = get_single_mode(this_mode, i);
    if (single_mode == NEWMV) {
      const uint8_t ref_frame_type = av1_ref_frame_type(mbmi->ref_frame);
      cur_mv[i] =
          (i == 0) ? x->mbmi_ext.ref_mv_stack[ref_frame_type][mbmi->ref_mv_idx]
                         .this_mv
                   : x->mbmi_ext.ref_mv_stack[ref_frame_type][mbmi->ref_mv_idx]
                         .comp_mv;
    } else {
      ret &= clamp_and_check_mv(cur_mv + i, this_mv, cm, x);
    }
  }
  return ret;
}